

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::GenerateFrameworkInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,string *fname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  cmValue cVar4;
  string *psVar5;
  ostream *poVar6;
  string_view value;
  cmNewLineStyle local_1ec;
  string inFile;
  string local_1c8;
  string inMod;
  ios_base local_138 [264];
  
  paVar1 = &inMod.field_2;
  inMod._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_FRAMEWORK_INFO_PLIST","")
  ;
  cVar4 = cmGeneratorTarget::GetProperty(target,&inMod);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inMod._M_dataplus._M_p != paVar1) {
    operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
  }
  if ((cVar4.Value == (string *)0x0) || ((cVar4.Value)->_M_string_length == 0)) {
    inFile._M_dataplus._M_p = (pointer)&inFile.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inFile,"MacOSXFrameworkInfo.plist.in","");
  }
  else {
    inFile._M_dataplus._M_p = (pointer)&inFile.field_2;
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&inFile,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
  }
  bVar3 = cmsys::SystemTools::FileIsFullPath(&inFile);
  if (!bVar3) {
    cmMakefile::GetModulesFile(&inMod,this->Makefile,&inFile);
    if (inMod._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&inFile);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = cmsys::SystemTools::FileExists(&inFile,true);
  if (bVar3) {
    this_00 = this->Makefile;
    cmMakefile::PushScope(this_00);
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&inMod,"MACOSX_FRAMEWORK_NAME","");
    value._M_str = (targetName->_M_dataplus)._M_p;
    value._M_len = targetName->_M_string_length;
    cmMakefile::AddDefinition(this_00,&inMod,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_FRAMEWORK_ICON_FILE","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_FRAMEWORK_IDENTIFIER","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_FRAMEWORK_SHORT_VERSION_STRING","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    inMod._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inMod,"MACOSX_FRAMEWORK_BUNDLE_VERSION","");
    cmLGInfoProp(this_00,target,&inMod);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)inMod._M_dataplus._M_p != paVar1) {
      operator_delete(inMod._M_dataplus._M_p,inMod.field_2._M_allocated_capacity + 1);
    }
    cmNewLineStyle::cmNewLineStyle(&local_1ec);
    cmMakefile::ConfigureFile(this_00,&inFile,fname,false,false,false,0,local_1ec);
    cmMakefile::PopScope(this_00);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&inMod);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&inMod,"Target ",7);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&inMod,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Info.plist template \"",0x16);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,inFile._M_dataplus._M_p,inFile._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" could not be found.",0x15);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inMod);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inFile._M_dataplus._M_p != &inFile.field_2) {
    operator_delete(inFile._M_dataplus._M_p,inFile.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateFrameworkInfoPList(
  cmGeneratorTarget* target, const std::string& targetName,
  const std::string& fname)
{
  // Find the Info.plist template.
  cmValue in = target->GetProperty("MACOSX_FRAMEWORK_INFO_PLIST");
  std::string inFile = cmNonempty(in) ? *in : "MacOSXFrameworkInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile)) {
    std::string inMod = this->Makefile->GetModulesFile(inFile);
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile, true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_FRAMEWORK_NAME", targetName);
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_BUNDLE_VERSION");
  mf->ConfigureFile(inFile, fname, false, false, false);
}